

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_0::expectSourceInfo
          (anon_unknown_0 *this,Reader sourceInfo,uint64_t expectedId,StringPtr expectedComment,
          initializer_list<const_kj::StringPtr> expectedMembers)

{
  bool bVar1;
  unsigned_long *puVar2;
  const_iterator pSVar3;
  Reader local_230;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_1c8;
  ArrayPtr<const_char> local_1b8;
  undefined1 local_1a8 [8];
  DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> _kjCondition_3;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Fault local_138;
  Fault f;
  uint local_128;
  DebugExpression<unsigned_int> local_124;
  undefined1 local_120 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_2;
  Reader members;
  undefined1 auStack_c0 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_b0;
  undefined1 local_a0 [8];
  DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> _kjCondition_1;
  uint64_t uStack_68;
  bool _kj_shouldLog;
  DebugExpression<unsigned_long> local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  uint64_t expectedId_local;
  initializer_list<const_kj::StringPtr> expectedMembers_local;
  StringPtr expectedComment_local;
  
  expectedMembers_local._M_array = expectedMembers._M_array;
  expectedId_local = expectedComment.content.size_;
  _kjCondition._32_8_ = this;
  expectedMembers_local._M_len = expectedId;
  uStack_68 = capnp::schema::Node::SourceInfo::Reader::getId(&sourceInfo);
  local_60 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff98);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_58,&local_60,
             (unsigned_long *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    _kjCondition_1._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._47_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,capnp::schema::Node::SourceInfo::Reader&,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,200,ERROR,
                 "\"failed: expected \" \"sourceInfo.getId() == expectedId\", _kjCondition, sourceInfo, expectedId"
                 ,(char (*) [50])"failed: expected sourceInfo.getId() == expectedId",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_58,&sourceInfo,
                 (unsigned_long *)&_kjCondition.result);
      _kjCondition_1._47_1_ = 0;
    }
  }
  _auStack_c0 = (ArrayPtr<const_char>)
                capnp::schema::Node::SourceInfo::Reader::getDocComment(&sourceInfo);
  local_b0 = (ArrayPtr<const_char>)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)auStack_c0);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)local_a0,
             (DebugExpression<capnp::Text::Reader> *)&local_b0,
             (StringPtr *)&expectedMembers_local._M_len);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    members.reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (members.reader._47_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&,capnp::schema::Node::SourceInfo::Reader&,kj::StringPtr&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xc9,ERROR,
                 "\"failed: expected \" \"sourceInfo.getDocComment() == expectedComment\", _kjCondition, sourceInfo, expectedComment"
                 ,(char (*) [63])"failed: expected sourceInfo.getDocComment() == expectedComment",
                 (DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)local_a0,&sourceInfo,
                 (StringPtr *)&expectedMembers_local._M_len);
      members.reader._47_1_ = 0;
    }
  }
  capnp::schema::Node::SourceInfo::Reader::getMembers((Reader *)&_kjCondition_2.result,&sourceInfo);
  local_128 = List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Reader::size
                        ((Reader *)&_kjCondition_2.result);
  local_124 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_128);
  f.exception = (Exception *)
                std::initializer_list<const_kj::StringPtr>::size
                          ((initializer_list<const_kj::StringPtr> *)&expectedId_local);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_120,&local_124,
             (unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
  if (bVar1) {
    ___begin2 = kj::indices<std::initializer_list<kj::StringPtr_const>&>
                          ((initializer_list<const_kj::StringPtr> *)&expectedId_local);
    __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,(Iterator *)&i),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar2 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
      _kjCondition_3._40_8_ = *puVar2;
      List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)local_1f8,(Reader *)&_kjCondition_2.result,(uint)_kjCondition_3._40_8_);
      local_1c8 = (ArrayPtr<const_char>)
                  capnp::schema::Node::SourceInfo::Member::Reader::getDocComment
                            ((Reader *)local_1f8);
      local_1b8 = (ArrayPtr<const_char>)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_1c8);
      pSVar3 = std::initializer_list<const_kj::StringPtr>::begin
                         ((initializer_list<const_kj::StringPtr> *)&expectedId_local);
      kj::_::DebugExpression<capnp::Text::Reader>::operator==
                ((DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> *)local_1a8,
                 (DebugExpression<capnp::Text::Reader> *)&local_1b8,pSVar3 + _kjCondition_3._40_8_);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
      if (!bVar1) {
        local_1f9 = kj::_::Debug::shouldLog(ERROR);
        while (local_1f9 != false) {
          List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Reader::operator[]
                    (&local_230,(Reader *)&_kjCondition_2.result,_kjCondition_3._40_4_);
          pSVar3 = std::initializer_list<const_kj::StringPtr>::begin
                             ((initializer_list<const_kj::StringPtr> *)&expectedId_local);
          kj::_::Debug::
          log<char_const(&)[74],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr_const&>&,capnp::schema::Node::SourceInfo::Member::Reader,kj::StringPtr_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                     ,0xcf,ERROR,
                     "\"failed: expected \" \"members[i].getDocComment() == expectedMembers.begin()[i]\", _kjCondition, members[i], expectedMembers.begin()[i]"
                     ,(char (*) [74])
                      "failed: expected members[i].getDocComment() == expectedMembers.begin()[i]",
                     (DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> *)local_1a8,
                     &local_230,pSVar3 + _kjCondition_3._40_8_);
          local_1f9 = false;
        }
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end2);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
            (&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,0xcc,FAILED,"members.size() == expectedMembers.size()","_kjCondition,",
             (DebugComparison<unsigned_int,_unsigned_long> *)local_120);
  kj::_::Debug::Fault::fatal(&local_138);
}

Assistant:

void expectSourceInfo(schema::Node::SourceInfo::Reader sourceInfo,
                   uint64_t expectedId, kj::StringPtr expectedComment,
                   std::initializer_list<const kj::StringPtr> expectedMembers) {
  KJ_EXPECT(sourceInfo.getId() == expectedId, sourceInfo, expectedId);
  KJ_EXPECT(sourceInfo.getDocComment() == expectedComment, sourceInfo, expectedComment);

  auto members = sourceInfo.getMembers();
  KJ_ASSERT(members.size() == expectedMembers.size());
  for (auto i: kj::indices(expectedMembers)) {
    KJ_EXPECT(members[i].getDocComment() == expectedMembers.begin()[i],
              members[i], expectedMembers.begin()[i]);
  }
}